

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

parser_node * amrex::parser_newf2(parser_f2_t ftype,parser_node *l,parser_node *r)

{
  parser_node *ppVar1;
  
  ppVar1 = (parser_node *)malloc(0x20);
  ppVar1->type = PARSER_F2;
  ppVar1->l = l;
  ppVar1->r = r;
  (ppVar1->lvp).ip = ftype;
  return ppVar1;
}

Assistant:

struct parser_node*
parser_newf2 (enum parser_f2_t ftype, struct parser_node* l, struct parser_node* r)
{
    auto tmp = (struct parser_f2*) std::malloc(sizeof(struct parser_f2));
    tmp->type = PARSER_F2;
    tmp->l = l;
    tmp->r = r;
    tmp->ftype = ftype;
    return (struct parser_node*) tmp;
}